

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsourcedata.cpp
# Opt level: O1

void __thiscall jrtplib::RTPSourceData::~RTPSourceData(RTPSourceData *this)

{
  list<jrtplib::RTPPacket_*,_std::allocator<jrtplib::RTPPacket_*>_> *this_00;
  _List_node_base *p_Var1;
  RTPMemoryManager *pRVar2;
  RTPAddress *pRVar3;
  _List_node_base *p_Var4;
  
  (this->super_RTPMemoryObject)._vptr_RTPMemoryObject = (_func_int **)&PTR__RTPSourceData_0013ecb8;
  this_00 = &this->packetlist;
  for (p_Var4 = (this->packetlist).
                super__List_base<jrtplib::RTPPacket_*,_std::allocator<jrtplib::RTPPacket_*>_>.
                _M_impl._M_node.super__List_node_base._M_next; p_Var4 != (_List_node_base *)this_00;
      p_Var4 = p_Var4->_M_next) {
    p_Var1 = p_Var4[1]._M_next;
    pRVar2 = (this->super_RTPMemoryObject).mgr;
    if (pRVar2 == (RTPMemoryManager *)0x0) {
      if (p_Var1 != (_List_node_base *)0x0) {
        (**(code **)((long)p_Var1->_M_next + 8))(p_Var1);
      }
    }
    else {
      (**(code **)p_Var1->_M_next)(p_Var1);
      (**(code **)(*(long *)pRVar2 + 0x18))(pRVar2,p_Var1);
    }
  }
  std::__cxx11::list<jrtplib::RTPPacket_*,_std::allocator<jrtplib::RTPPacket_*>_>::clear(this_00);
  if (this->byereason != (uint8_t *)0x0) {
    pRVar2 = (this->super_RTPMemoryObject).mgr;
    if (pRVar2 == (RTPMemoryManager *)0x0) {
      operator_delete__(this->byereason);
    }
    else {
      (**(code **)(*(long *)pRVar2 + 0x18))();
    }
  }
  pRVar3 = this->rtpaddr;
  if (pRVar3 != (RTPAddress *)0x0) {
    pRVar2 = (this->super_RTPMemoryObject).mgr;
    if (pRVar2 == (RTPMemoryManager *)0x0) {
      (*pRVar3->_vptr_RTPAddress[4])(pRVar3);
    }
    else {
      (*pRVar3->_vptr_RTPAddress[3])(pRVar3);
      (**(code **)(*(long *)pRVar2 + 0x18))(pRVar2,pRVar3);
    }
  }
  pRVar3 = this->rtcpaddr;
  if (pRVar3 != (RTPAddress *)0x0) {
    pRVar2 = (this->super_RTPMemoryObject).mgr;
    if (pRVar2 == (RTPMemoryManager *)0x0) {
      (*pRVar3->_vptr_RTPAddress[4])(pRVar3);
    }
    else {
      (*pRVar3->_vptr_RTPAddress[3])(pRVar3);
      (**(code **)(*(long *)pRVar2 + 0x18))(pRVar2,pRVar3);
    }
  }
  RTCPSDESInfo::~RTCPSDESInfo(&this->SDESinf);
  p_Var4 = (this->packetlist).
           super__List_base<jrtplib::RTPPacket_*,_std::allocator<jrtplib::RTPPacket_*>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  while (p_Var4 != (_List_node_base *)this_00) {
    p_Var1 = p_Var4->_M_next;
    operator_delete(p_Var4,0x18);
    p_Var4 = p_Var1;
  }
  return;
}

Assistant:

RTPSourceData::~RTPSourceData()
{
	FlushPackets();
	if (byereason)
		RTPDeleteByteArray(byereason,GetMemoryManager());
	if (rtpaddr)
		RTPDelete(rtpaddr,GetMemoryManager());
	if (rtcpaddr)
		RTPDelete(rtcpaddr,GetMemoryManager());
}